

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall sf2cute::SFZone::SFZone(SFZone *this,SFZone *origin)

{
  bool bVar1;
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  *pvVar2;
  size_type sVar3;
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  *pvVar4;
  undefined1 local_78 [16];
  unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_> *modulator;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  *__range1_1;
  reference local_48;
  unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> *generator;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  *__range1;
  SFZone *origin_local;
  SFZone *this_local;
  
  this->_vptr_SFZone = (_func_int **)&PTR__SFZone_00163798;
  std::
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ::vector(&this->generators_);
  std::
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ::vector(&this->modulators_);
  pvVar2 = generators(origin);
  sVar3 = std::
          vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
          ::size(pvVar2);
  std::
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ::reserve(&this->generators_,sVar3);
  pvVar2 = generators(origin);
  __end1 = std::
           vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ::begin(pvVar2);
  generator = (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
               *)std::
                 vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                 ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
                                *)&generator);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>::
    operator*(local_48);
    std::make_unique<sf2cute::SFGeneratorItem,sf2cute::SFGeneratorItem&>
              ((SFGeneratorItem *)&__range1_1);
    std::
    vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ::push_back(&this->generators_,(value_type *)&__range1_1);
    std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
                 *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar4 = modulators(origin);
  sVar3 = std::
          vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
          ::size(pvVar4);
  std::
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ::reserve(&this->modulators_,sVar3);
  pvVar4 = modulators(origin);
  __end1_1 = std::
             vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
             ::begin(pvVar4);
  modulator = (unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
               *)std::
                 vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                 ::end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>_>
                        *)&modulator);
    if (!bVar1) break;
    local_78._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>_>
         ::operator*(&__end1_1);
    std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>::
    operator*((unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
               *)local_78._8_8_);
    std::make_unique<sf2cute::SFModulatorItem,sf2cute::SFModulatorItem&>
              ((SFModulatorItem *)local_78);
    std::
    vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
    ::push_back(&this->modulators_,(value_type *)local_78);
    std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>::
    ~unique_ptr((unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                 *)local_78);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

SFZone::SFZone(const SFZone & origin) {
  // Copy generators.
  generators_.reserve(origin.generators().size());
  for (const auto & generator : origin.generators()) {
    generators_.push_back(std::make_unique<SFGeneratorItem>(*generator));
  }

  // Copy modulators.
  modulators_.reserve(origin.modulators().size());
  for (const auto & modulator : origin.modulators()) {
    modulators_.push_back(std::make_unique<SFModulatorItem>(*modulator));
  }
}